

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O3

Interval * __thiscall
tcu::FloatFormat::convert(Interval *__return_storage_ptr__,FloatFormat *this,Interval *x)

{
  YesNoMaybe YVar1;
  undefined1 uVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  double __x;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double __x_00;
  Interval local_60;
  Interval local_48;
  
  __return_storage_ptr__->m_hasNaN = false;
  dVar8 = INFINITY;
  dVar9 = -INFINITY;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar7 = x->m_lo;
  dVar10 = x->m_hi;
  if (x->m_hasNaN == true) {
    YVar1 = this->m_hasNaN;
    __x = -INFINITY;
    __x_00 = INFINITY;
    if (YVar1 == NO) {
      cVar3 = '\0';
    }
    else {
      __return_storage_ptr__->m_hasNaN = true;
      __return_storage_ptr__->m_hi = -INFINITY;
      uVar4 = 1;
      cVar3 = '\x01';
      if (YVar1 == YES) goto LAB_01990dc1;
    }
  }
  else {
    uVar4 = 0;
LAB_01990dc1:
    cVar3 = (char)uVar4;
    __x = dVar7;
    __x_00 = dVar10;
    if (dVar10 < dVar7) goto LAB_01990e92;
  }
  dVar7 = round(this,__x);
  clampValue(&local_48,this,dVar7);
  dVar7 = round(this,__x_00);
  clampValue(&local_60,this,dVar7);
  uVar4 = 1;
  if (cVar3 == '\0' && (local_48.m_hasNaN & 1U) == 0) {
    uVar4 = local_60._0_4_;
  }
  dVar7 = (double)(~-(ulong)(local_48.m_lo <= local_60.m_lo) & (ulong)local_60.m_lo |
                  (ulong)local_48.m_lo & -(ulong)(local_48.m_lo <= local_60.m_lo));
  dVar10 = (double)(~-(ulong)(local_60.m_hi <= local_48.m_hi) & (ulong)local_60.m_hi |
                   (ulong)local_48.m_hi & -(ulong)(local_60.m_hi <= local_48.m_hi));
  uVar5 = -(ulong)(INFINITY <= dVar7);
  uVar6 = -(ulong)(dVar10 <= -INFINITY);
  dVar8 = (double)(uVar5 & 0x7ff0000000000000 | ~uVar5 & (ulong)dVar7);
  dVar9 = (double)(uVar6 & 0xfff0000000000000 | ~uVar6 & (ulong)dVar10);
  __return_storage_ptr__->m_hasNaN = SUB41(uVar4,0);
  __return_storage_ptr__->m_lo = dVar8;
  __return_storage_ptr__->m_hi = dVar9;
LAB_01990e92:
  if (this->m_exactPrecision == false) {
    uVar2 = true;
    if ((uVar4 & 1) == 0) {
      uVar2 = (undefined1)*(undefined4 *)x;
    }
    __return_storage_ptr__->m_hasNaN = (bool)uVar2;
    dVar7 = x->m_hi;
    uVar5 = -(ulong)(dVar8 <= x->m_lo);
    uVar6 = -(ulong)(dVar7 <= dVar9);
    __return_storage_ptr__->m_lo = (double)(~uVar5 & (ulong)x->m_lo | (ulong)dVar8 & uVar5);
    __return_storage_ptr__->m_hi = (double)(~uVar6 & (ulong)dVar7 | (ulong)dVar9 & uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::convert (const Interval& x) const
{
	Interval ret;
	Interval tmp = x;

	if (x.hasNaN())
	{
		// If NaN might be supported, NaN is a legal return value
		if (m_hasNaN != NO)
			ret |= TCU_NAN;

		// If NaN might not be supported, any (non-NaN) value is legal,
		// _subject_ to clamping. Hence we modify tmp, not ret.
		if (m_hasNaN != YES)
			tmp = Interval::unbounded();
	}

	// Round both bounds _inwards_ to closest representable values.
	if (!tmp.empty())
		ret |= clampValue(round(tmp.lo(), true)) | clampValue(round(tmp.hi(), false));

	// If this format's precision is not exact, the (possibly out-of-bounds)
	// original value is also a possible result.
	if (!m_exactPrecision)
		ret |= x;

	return ret;
}